

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_hashmap.h
# Opt level: O3

void __thiscall
v_hashmap<unsigned_long,_features>::put_after_get
          (v_hashmap<unsigned_long,_features> *this,unsigned_long *key,uint64_t hash,features *val)

{
  hash_elem *phVar1;
  size_t sVar2;
  hash_elem *phVar3;
  size_t sVar4;
  long lVar5;
  features *pfVar6;
  byte bVar7;
  
  bVar7 = 0;
  phVar3 = (this->dat)._begin;
  sVar4 = this->last_position;
  if ((phVar3[sVar4].occupied == false) &&
     (phVar1 = (this->dat).end_array, sVar2 = this->num_occupants, this->num_occupants = sVar2 + 1,
     (ulong)((long)phVar1 - (long)phVar3 >> 7) <= sVar2 * 4 + 4)) {
    double_size(this);
    get(this,key,hash);
    phVar3 = (this->dat)._begin;
    sVar4 = this->last_position;
  }
  phVar3[sVar4].occupied = true;
  (this->dat)._begin[this->last_position].key = *key;
  phVar3 = (this->dat)._begin;
  sVar4 = this->last_position;
  phVar3[sVar4].val.sum_feat_sq = val->sum_feat_sq;
  pfVar6 = &phVar3[sVar4].val;
  for (lVar5 = 0xc; lVar5 != 0; lVar5 = lVar5 + -1) {
    (pfVar6->values)._begin = (val->values)._begin;
    val = (features *)((long)val + (ulong)bVar7 * -0x10 + 8);
    pfVar6 = (features *)((long)pfVar6 + ((ulong)bVar7 * -2 + 1) * 8);
  }
  (this->dat)._begin[this->last_position].hash = hash;
  return;
}

Assistant:

void put_after_get(const K& key, uint64_t hash, const V& val)
  {
    if (!dat[last_position].occupied)
    {
      num_occupants++;
      if (num_occupants * 4 >= base_size())  // grow when we're a quarter full
      {
        double_size();
        get(key, hash);  // probably should change last_position-- this is the lazy man's way to do it
      }
    }

    // now actually insert it
    put_after_get_nogrow(key, hash, val);
  }